

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulatingstroker.cpp
# Opt level: O3

void __thiscall QTriangulatingStroker::endCap(QTriangulatingStroker *this,qreal *param_1)

{
  QVLAStorage<4UL,_4UL,_256LL> *__s;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  void *pvVar5;
  void *pvVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  QVarLengthArray<float,_256LL> local_450;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(this + 100) == 0x20) {
    __s = &local_450.super_QVLAStorage<4UL,_4UL,_256LL>;
    memset(__s,0xaa,0x400);
    local_450.super_QVLABase<float>.super_QVLABaseBase.a = 0x100;
    local_450.super_QVLABase<float>.super_QVLABaseBase.s = 0;
    lVar9 = *(long *)(this + 0x10);
    lVar8 = *(long *)(this + 8) << 0x20;
    local_450.super_QVLABase<float>.super_QVLABaseBase.ptr = __s;
    arcPoints(this,*(float *)(this + 0x18),*(float *)(this + 0x1c),
              *(float *)(lVar9 + (lVar8 + -0x200000000 >> 0x1e)),
              *(float *)(lVar9 + (lVar8 + -0x100000000 >> 0x1e)),
              *(float *)(lVar9 + (lVar8 + -0x400000000 >> 0x1e)),
              *(float *)(lVar9 + (lVar8 + -0x300000000 >> 0x1e)),&local_450);
    iVar7 = (int)(local_450.super_QVLABase<float>.super_QVLABaseBase.s / 2);
    if (iVar7 != 0) {
      lVar9 = *(long *)(this + 8);
      uVar10 = 0;
      uVar12 = (long)iVar7;
      do {
        pvVar5 = local_450.super_QVLABase<float>.super_QVLABaseBase.ptr;
        QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar9 + 1);
        pvVar6 = local_450.super_QVLABase<float>.super_QVLABaseBase.ptr;
        lVar9 = *(long *)(this + 8);
        *(undefined4 *)(*(long *)(this + 0x10) + lVar9 * 4) =
             *(undefined4 *)((char *)pvVar5 + uVar12 * 8 + -8);
        *(long *)(this + 8) = lVar9 + 1;
        QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar9 + 2);
        pvVar5 = local_450.super_QVLABase<float>.super_QVLABaseBase.ptr;
        lVar9 = *(long *)(this + 8);
        *(undefined4 *)(*(long *)(this + 0x10) + lVar9 * 4) =
             *(undefined4 *)((char *)pvVar6 + uVar12 * 8 + -4);
        *(long *)(this + 8) = lVar9 + 1;
        uVar11 = uVar12 - 1 & 0xffffffff;
        if (uVar10 == uVar11) break;
        QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar9 + 2);
        pvVar6 = local_450.super_QVLABase<float>.super_QVLABaseBase.ptr;
        lVar9 = *(long *)(this + 8);
        *(undefined4 *)(*(long *)(this + 0x10) + lVar9 * 4) =
             *(undefined4 *)((char *)pvVar5 + uVar10 * 8);
        *(long *)(this + 8) = lVar9 + 1;
        QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar9 + 2);
        lVar9 = *(long *)(this + 8);
        *(undefined4 *)(*(long *)(this + 0x10) + lVar9 * 4) =
             *(undefined4 *)((char *)pvVar6 + uVar10 * 8 + 4);
        lVar9 = lVar9 + 1;
        *(long *)(this + 8) = lVar9;
        uVar10 = uVar10 + 1;
        uVar12 = uVar12 - 1;
      } while (uVar10 != uVar11);
    }
    if ((QVLAStorage<4UL,_4UL,_256LL> *)local_450.super_QVLABase<float>.super_QVLABaseBase.ptr !=
        __s) {
      QtPrivate::sizedFree
                (local_450.super_QVLABase<float>.super_QVLABaseBase.ptr,
                 local_450.super_QVLABase<float>.super_QVLABaseBase.a << 2);
    }
  }
  else if (*(int *)(this + 100) == 0x10) {
    fVar1 = *(float *)(this + 0x24);
    fVar2 = *(float *)(this + 0x18);
    fVar3 = *(float *)(this + 0x1c);
    fVar4 = *(float *)(this + 0x20);
    QDataBuffer<float>::reserve((QDataBuffer<float> *)this,*(long *)(this + 8) + 1);
    lVar9 = *(long *)(this + 8);
    *(float *)(*(long *)(this + 0x10) + lVar9 * 4) = fVar2 + fVar1 + fVar4;
    *(long *)(this + 8) = lVar9 + 1;
    QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar9 + 2);
    lVar9 = *(long *)(this + 8);
    *(float *)(*(long *)(this + 0x10) + lVar9 * 4) = fVar1 + (fVar3 - fVar4);
    *(long *)(this + 8) = lVar9 + 1;
    QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar9 + 2);
    lVar9 = *(long *)(this + 8);
    *(float *)(*(long *)(this + 0x10) + lVar9 * 4) = (fVar2 + fVar1) - fVar4;
    *(long *)(this + 8) = lVar9 + 1;
    QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar9 + 2);
    lVar9 = *(long *)(this + 8);
    *(float *)(*(long *)(this + 0x10) + lVar9 * 4) = (fVar3 - fVar4) - fVar1;
    *(long *)(this + 8) = lVar9 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTriangulatingStroker::endCap(const qreal *)
{
    switch (m_cap_style) {
    case Qt::FlatCap:
        break;
    case Qt::SquareCap:
        emitLineSegment(m_cx + m_nvy, m_cy - m_nvx, m_nvx, m_nvy);
        break;
    case Qt::RoundCap: {
        QVarLengthArray<float> points;
        int count = m_vertices.size();
        arcPoints(m_cx, m_cy, m_vertices.at(count - 2), m_vertices.at(count - 1), m_vertices.at(count - 4), m_vertices.at(count - 3), points);
        int front = 0;
        int end = points.size() / 2;
        while (front != end) {
            m_vertices.add(points[2 * end - 2]);
            m_vertices.add(points[2 * end - 1]);
            --end;
            if (front == end)
                break;
            m_vertices.add(points[2 * front + 0]);
            m_vertices.add(points[2 * front + 1]);
            ++front;
        }
        break; }
    default: break; // to shut gcc up...
    }
}